

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxeffectslot.cpp
# Opt level: O1

void alGenAuxiliaryEffectSlots(ALsizei n,ALuint *effectslots)

{
  uint uVar1;
  pointer pEVar2;
  ulong __n;
  ulong uVar3;
  ALeffectslot *pAVar4;
  pointer pEVar5;
  EffectSlotSubList *this;
  char *pcVar6;
  ulong uVar7;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> slotlock;
  ALCcontext *local_78;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_68;
  ALuint *local_48;
  unique_lock<std::mutex> local_40;
  
  GetContextRef();
  if (local_78 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_78,0xa003,"Generating %d effect slots",(ulong)(uint)n);
    }
    if (0 < n) {
      local_40._M_device = &local_78->mEffectSlotLock;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      uVar1 = ((local_78->mDevice).mPtr)->AuxiliaryEffectSlotMax;
      if (uVar1 - local_78->mNumEffectSlots < (uint)n) {
        ALCcontext::setError
                  (local_78,0xa005,"Exceeding %u effect slot limit (%u + %d)",(ulong)uVar1,
                   (ulong)local_78->mNumEffectSlots,(ulong)(uint)n);
      }
      else {
        __n = (ulong)(uint)n;
        pEVar5 = (local_78->mEffectSlotList).
                 super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar2 = (local_78->mEffectSlotList).
                 super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pEVar5 == pEVar2) {
          uVar3 = 0;
        }
        else {
          uVar3 = 0;
          do {
            uVar7 = pEVar5->FreeMask - (pEVar5->FreeMask >> 1 & 0x5555555555555555);
            uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
            uVar3 = uVar3 + (((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
            ;
            pEVar5 = pEVar5 + 1;
          } while (pEVar5 != pEVar2);
        }
        local_48 = effectslots;
        for (; uVar3 < __n; uVar3 = uVar3 + 0x40) {
          if (0x1ffffff0 <
              (ulong)((long)(local_78->mEffectSlotList).
                            super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_78->mEffectSlotList).
                           super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
LAB_00116a43:
            if (uVar3 < __n) {
              pcVar6 = "s";
              if (n == 1) {
                pcVar6 = "";
              }
              ALCcontext::setError
                        (local_78,0xa005,"Failed to allocate %d effectslot%s",(ulong)(uint)n,pcVar6)
              ;
              goto LAB_00116921;
            }
            break;
          }
          std::vector<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>::emplace_back<>
                    (&local_78->mEffectSlotList);
          pEVar5 = (local_78->mEffectSlotList).
                   super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pEVar5[-1].FreeMask = 0xffffffffffffffff;
          pAVar4 = (ALeffectslot *)al_calloc(8,0x7a00);
          pEVar5[-1].EffectSlots = pAVar4;
          if (pAVar4 == (ALeffectslot *)0x0) {
            this = (local_78->mEffectSlotList).
                   super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
            (local_78->mEffectSlotList).
            super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>._M_impl.
            super__Vector_impl_data._M_finish = this;
            EffectSlotSubList::~EffectSlotSubList(this);
            goto LAB_00116a43;
          }
        }
        if (n == 1) {
          pAVar4 = anon_unknown.dwarf_8f0f::AllocEffectSlot(local_78);
          if (pAVar4 != (ALeffectslot *)0x0) {
            *local_48 = pAVar4->id;
          }
        }
        else {
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_start = (ALuint *)0x0;
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_68,__n);
          do {
            pAVar4 = anon_unknown.dwarf_8f0f::AllocEffectSlot(local_78);
            if (pAVar4 == (ALeffectslot *)0x0) {
              std::unique_lock<std::mutex>::unlock(&local_40);
              alDeleteAuxiliaryEffectSlots
                        ((ALsizei)((ulong)((long)local_68.
                                                 super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_68.
                                                super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 2),
                         local_68.
                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                         .super__Vector_impl_data._M_start);
            }
            else if (local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                     _M_impl.super__Vector_impl_data._M_finish ==
                     local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                         .super__Vector_impl_data._M_finish,&pAVar4->id);
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
               super__Vector_impl_data._M_finish = pAVar4->id;
              local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (pAVar4 == (ALeffectslot *)0x0) {
              if (local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start != (ALuint *)0x0) {
                al_free(local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>
                        ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_00116921;
            }
            n = n + -1;
          } while (n != 0);
          alGenAuxiliaryEffectSlots_cold_1();
        }
      }
LAB_00116921:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    }
  }
  if (local_78 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_78->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenAuxiliaryEffectSlots(ALsizei n, ALuint *effectslots)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effect slots", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> slotlock{context->mEffectSlotLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->AuxiliaryEffectSlotMax-context->mNumEffectSlots)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u effect slot limit (%u + %d)",
            device->AuxiliaryEffectSlotMax, context->mNumEffectSlots, n);
        return;
    }
    if(!EnsureEffectSlots(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effectslot%s", n,
            (n==1) ? "" : "s");
        return;
    }

    if(n == 1)
    {
        ALeffectslot *slot{AllocEffectSlot(context.get())};
        if(!slot) return;
        effectslots[0] = slot->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ALsizei count{n};
        ids.reserve(static_cast<ALuint>(count));
        do {
            ALeffectslot *slot{AllocEffectSlot(context.get())};
            if(!slot)
            {
                slotlock.unlock();
                alDeleteAuxiliaryEffectSlots(static_cast<ALsizei>(ids.size()), ids.data());
                return;
            }
            ids.emplace_back(slot->id);
        } while(--count);
        std::copy(ids.cbegin(), ids.cend(), effectslots);
    }
}